

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeCommand.cxx
# Opt level: O2

bool cmIncludeCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  cmMakefile *pcVar3;
  cmExecutionStatus *pcVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  PolicyStatus PVar10;
  int iVar11;
  mapped_type *pmVar12;
  iterator iVar13;
  string *psVar14;
  cmGlobalGenerator *this;
  ostream *poVar15;
  size_t sVar16;
  PolicyID id;
  PolicyID id_00;
  char *pcVar17;
  uint uVar18;
  MessageType t;
  ulong uVar19;
  _Alloc_hider __s;
  string_view name;
  string_view value;
  string_view value_00;
  bool system;
  cmExecutionStatus *local_258;
  string m;
  string fname;
  string fname_abs;
  string resultVarName;
  string listFile;
  string local_50;
  
  if ((cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::DeprecatedModules_abi_cxx11_ == '\0') &&
     (iVar11 = __cxa_guard_acquire(&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                    ::DeprecatedModules_abi_cxx11_), iVar11 != 0)) {
    cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::DeprecatedModules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::DeprecatedModules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::DeprecatedModules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::DeprecatedModules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
    cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::DeprecatedModules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
          ::DeprecatedModules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header;
    cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
    ::DeprecatedModules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
                 ::~map,&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::DeprecatedModules_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::DeprecatedModules_abi_cxx11_);
  }
  if (cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
      ::DeprecatedModules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&listFile,"Dart",(allocator<char> *)&fname);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
              ::operator[](&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                            ::DeprecatedModules_abi_cxx11_,&listFile);
    *pmVar12 = CMP0145;
    std::__cxx11::string::~string((string *)&listFile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&listFile,"Documentation",(allocator<char> *)&fname);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
              ::operator[](&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                            ::DeprecatedModules_abi_cxx11_,&listFile);
    *pmVar12 = CMP0106;
    std::__cxx11::string::~string((string *)&listFile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&listFile,"FindCUDA",(allocator<char> *)&fname);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
              ::operator[](&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                            ::DeprecatedModules_abi_cxx11_,&listFile);
    *pmVar12 = CMP0146;
    std::__cxx11::string::~string((string *)&listFile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&listFile,"FindDart",(allocator<char> *)&fname);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
              ::operator[](&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                            ::DeprecatedModules_abi_cxx11_,&listFile);
    *pmVar12 = CMP0145;
    std::__cxx11::string::~string((string *)&listFile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&listFile,"FindPythonInterp",(allocator<char> *)&fname);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
              ::operator[](&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                            ::DeprecatedModules_abi_cxx11_,&listFile);
    *pmVar12 = CMP0148;
    std::__cxx11::string::~string((string *)&listFile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&listFile,"FindPythonLibs",(allocator<char> *)&fname);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
              ::operator[](&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                            ::DeprecatedModules_abi_cxx11_,&listFile);
    *pmVar12 = CMP0148;
    std::__cxx11::string::~string((string *)&listFile);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&listFile,"WriteCompilerDetectionHeader",(allocator<char> *)&fname);
    pmVar12 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
              ::operator[](&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                            ::DeprecatedModules_abi_cxx11_,&listFile);
    *pmVar12 = CMP0120;
    std::__cxx11::string::~string((string *)&listFile);
  }
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar1 || 0x80 < (ulong)((long)pbVar2 - (long)pbVar1)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&listFile,
               "called with wrong number of arguments.  include() only takes one file.",
               (allocator<char> *)&fname);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&listFile);
    return false;
  }
  local_258 = status;
  std::__cxx11::string::string((string *)&fname,(string *)pbVar1);
  resultVarName._M_dataplus._M_p = (pointer)&resultVarName.field_2;
  resultVarName._M_string_length = 0;
  resultVarName.field_2._M_local_buf[0] = '\0';
  uVar19 = 1;
  bVar9 = false;
  bVar7 = false;
  while( true ) {
    uVar18 = (uint)uVar19;
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar19)
    break;
    bVar5 = std::operator==(pbVar1 + uVar19,"OPTIONAL");
    if (bVar5) {
      bVar5 = true;
      if (bVar7) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&listFile,"called with invalid arguments: OPTIONAL used twice",
                   (allocator<char> *)&fname_abs);
        std::__cxx11::string::_M_assign((string *)&local_258->Error);
        goto LAB_0035b9d9;
      }
    }
    else {
      bVar6 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar19,"RESULT_VARIABLE")
      ;
      bVar5 = bVar7;
      if (bVar6) {
        if (resultVarName._M_string_length == 0) {
          uVar18 = uVar18 + 1;
          if ((ulong)uVar18 <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5)) {
            std::__cxx11::string::_M_assign((string *)&resultVarName);
            goto LAB_0035b801;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&listFile,"called with no value for RESULT_VARIABLE.",
                     (allocator<char> *)&fname_abs);
          std::__cxx11::string::_M_assign((string *)&local_258->Error);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&listFile,
                     "called with invalid arguments: only one result variable allowed",
                     (allocator<char> *)&fname_abs);
          std::__cxx11::string::_M_assign((string *)&local_258->Error);
        }
LAB_0035b9d9:
        std::__cxx11::string::~string((string *)&listFile);
        bVar5 = false;
        goto LAB_0035bd79;
      }
      bVar7 = std::operator==((args->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + uVar19,"NO_POLICY_SCOPE")
      ;
      if (bVar7) {
        bVar9 = true;
      }
      else if (1 < uVar18) {
        cmStrCat<char_const(&)[31],std::__cxx11::string_const&>
                  (&listFile,(char (*) [31])"called with invalid argument: ",
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + uVar19);
        std::__cxx11::string::_M_assign((string *)&local_258->Error);
        goto LAB_0035b9d9;
      }
    }
LAB_0035b801:
    bVar7 = bVar5;
    uVar19 = (ulong)(uVar18 + 1);
  }
  if (fname._M_string_length == 0) {
    pcVar3 = local_258->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&listFile,"include() given empty file name (ignored).",
               (allocator<char> *)&fname_abs);
    cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&listFile);
    std::__cxx11::string::~string((string *)&listFile);
    bVar5 = true;
    goto LAB_0035bd79;
  }
  bVar5 = cmsys::SystemTools::FileIsFullPath(&fname);
  pcVar4 = local_258;
  if (!bVar5) {
    system = false;
    cmStrCat<std::__cxx11::string&,char_const(&)[7]>(&listFile,&fname,(char (*) [7])0x738ccb);
    name._M_str = listFile._M_dataplus._M_p;
    name._M_len = listFile._M_string_length;
    cmMakefile::GetModulesFile_abi_cxx11_(&fname_abs,pcVar4->Makefile,name,&system);
    if ((system == true) &&
       (iVar13 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
                 ::find(&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::DeprecatedModules_abi_cxx11_._M_t,&fname),
       (_Rb_tree_header *)iVar13._M_node !=
       &cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::DeprecatedModules_abi_cxx11_._M_t._M_impl.super__Rb_tree_header)) {
      PVar10 = cmMakefile::GetPolicyStatus(pcVar4->Makefile,iVar13._M_node[2]._M_color,false);
      if (PVar10 - NEW < 3) {
        std::__cxx11::string::assign((char *)&fname_abs);
      }
      else if (PVar10 == WARN) {
        pcVar3 = pcVar4->Makefile;
        cmPolicies::GetPolicyWarning_abi_cxx11_
                  (&local_50,(cmPolicies *)(ulong)iVar13._M_node[2]._M_color,id);
        cmStrCat<std::__cxx11::string,char_const(&)[2]>(&m,&local_50,(char (*) [2])0x75c6b6);
        cmMakefile::IssueMessage(pcVar3,AUTHOR_WARNING,&m);
        std::__cxx11::string::~string((string *)&m);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
    if (fname_abs._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&fname);
    }
    std::__cxx11::string::~string((string *)&fname_abs);
    std::__cxx11::string::~string((string *)&listFile);
  }
  psVar14 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar4->Makefile);
  cmsys::SystemTools::CollapseFullPath(&fname_abs,&fname,psVar14);
  this = cmMakefile::GetGlobalGenerator(pcVar4->Makefile);
  bVar5 = cmGlobalGenerator::IsExportedTargetsFile(this,&fname_abs);
  if (bVar5) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&listFile);
    PVar10 = cmMakefile::GetPolicyStatus(pcVar4->Makefile,CMP0024,false);
    if (2 < PVar10 - NEW) {
      if (PVar10 == WARN) {
        cmPolicies::GetPolicyWarning_abi_cxx11_(&m,(cmPolicies *)0x18,id_00);
        poVar15 = std::operator<<((ostream *)&listFile,(string *)&m);
        std::operator<<(poVar15,"\n");
        std::__cxx11::string::~string((string *)&m);
        bVar5 = false;
        pcVar17 = "should";
        t = AUTHOR_WARNING;
        goto LAB_0035bb2e;
      }
LAB_0035bbc0:
      cmGlobalGenerator::CreateGenerationObjects(this,AllTargets);
      cmGlobalGenerator::GenerateImportFile(this,&fname_abs);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&listFile);
      goto LAB_0035bbe4;
    }
    t = FATAL_ERROR;
    bVar5 = true;
    pcVar17 = "may";
LAB_0035bb2e:
    poVar15 = std::operator<<((ostream *)&listFile,"The file\n  ");
    poVar15 = std::operator<<(poVar15,(string *)&fname_abs);
    poVar15 = std::operator<<(poVar15,"\nwas generated by the export() command.  It ");
    poVar15 = std::operator<<(poVar15,pcVar17);
    std::operator<<(poVar15,
                    " not be used as the argument to the include() command.  Use ALIAS targets instead to refer to targets by alternative names.\n"
                   );
    pcVar3 = pcVar4->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar3,t,&m);
    std::__cxx11::string::~string((string *)&m);
    if (!bVar5) goto LAB_0035bbc0;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&listFile);
    bVar5 = false;
  }
  else {
LAB_0035bbe4:
    psVar14 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar4->Makefile);
    cmsys::SystemTools::CollapseFullPath(&listFile,&fname,psVar14);
    bVar6 = cmsys::SystemTools::FileExists(&listFile);
    bVar8 = cmsys::SystemTools::FileIsDirectory(&listFile);
    if (bVar6 && !bVar8) {
LAB_0035bc98:
      bVar9 = cmMakefile::ReadDependentFile(pcVar4->Makefile,&listFile,bVar9);
      if (resultVarName._M_string_length != 0) {
        pcVar3 = pcVar4->Makefile;
        __s = fname_abs._M_dataplus;
        if (!bVar9) {
          __s._M_p = "NOTFOUND";
        }
        sVar16 = strlen(__s._M_p);
        value_00._M_str = __s._M_p;
        value_00._M_len = sVar16;
        cmMakefile::AddDefinition(pcVar3,&resultVarName,value_00);
      }
      bVar5 = true;
      if ((!bVar9 && !bVar7) && (bVar7 = cmSystemTools::GetFatalErrorOccurred(), !bVar7)) {
        cmStrCat<char_const(&)[34],std::__cxx11::string&>
                  (&m,(char (*) [34])"could not load requested file:\n  ",&fname);
        std::__cxx11::string::_M_assign((string *)&pcVar4->Error);
LAB_0035bd56:
        std::__cxx11::string::~string((string *)&m);
        bVar5 = false;
      }
    }
    else {
      if (resultVarName._M_string_length != 0) {
        value._M_str = "NOTFOUND";
        value._M_len = 8;
        cmMakefile::AddDefinition(pcVar4->Makefile,&resultVarName,value);
      }
      bVar5 = true;
      if (!bVar7) {
        if (bVar6) {
          if (!bVar8) goto LAB_0035bc98;
          cmStrCat<char_const(&)[34],std::__cxx11::string&>
                    (&m,(char (*) [34])"requested file is a directory:\n  ",&fname);
          std::__cxx11::string::_M_assign((string *)&pcVar4->Error);
        }
        else {
          cmStrCat<char_const(&)[34],std::__cxx11::string&>
                    (&m,(char (*) [34])"could not find requested file:\n  ",&fname);
          std::__cxx11::string::_M_assign((string *)&pcVar4->Error);
        }
        goto LAB_0035bd56;
      }
    }
    std::__cxx11::string::~string((string *)&listFile);
  }
  std::__cxx11::string::~string((string *)&fname_abs);
LAB_0035bd79:
  std::__cxx11::string::~string((string *)&resultVarName);
  std::__cxx11::string::~string((string *)&fname);
  return bVar5;
}

Assistant:

bool cmIncludeCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  static std::map<std::string, cmPolicies::PolicyID> DeprecatedModules;
  if (DeprecatedModules.empty()) {
    DeprecatedModules["Dart"] = cmPolicies::CMP0145;
    DeprecatedModules["Documentation"] = cmPolicies::CMP0106;
    DeprecatedModules["FindCUDA"] = cmPolicies::CMP0146;
    DeprecatedModules["FindDart"] = cmPolicies::CMP0145;
    DeprecatedModules["FindPythonInterp"] = cmPolicies::CMP0148;
    DeprecatedModules["FindPythonLibs"] = cmPolicies::CMP0148;
    DeprecatedModules["WriteCompilerDetectionHeader"] = cmPolicies::CMP0120;
  }

  if (args.empty() || args.size() > 4) {
    status.SetError("called with wrong number of arguments.  "
                    "include() only takes one file.");
    return false;
  }
  bool optional = false;
  bool noPolicyScope = false;
  std::string fname = args[0];
  std::string resultVarName;

  for (unsigned int i = 1; i < args.size(); i++) {
    if (args[i] == "OPTIONAL") {
      if (optional) {
        status.SetError("called with invalid arguments: OPTIONAL used twice");
        return false;
      }
      optional = true;
    } else if (args[i] == "RESULT_VARIABLE") {
      if (!resultVarName.empty()) {
        status.SetError("called with invalid arguments: "
                        "only one result variable allowed");
        return false;
      }
      if (++i < args.size()) {
        resultVarName = args[i];
      } else {
        status.SetError("called with no value for RESULT_VARIABLE.");
        return false;
      }
    } else if (args[i] == "NO_POLICY_SCOPE") {
      noPolicyScope = true;
    } else if (i > 1) // compat.: in previous cmake versions the second
                      // parameter was ignored if it wasn't "OPTIONAL"
    {
      std::string errorText =
        cmStrCat("called with invalid argument: ", args[i]);
      status.SetError(errorText);
      return false;
    }
  }

  if (fname.empty()) {
    status.GetMakefile().IssueMessage(
      MessageType::AUTHOR_WARNING,
      "include() given empty file name (ignored).");
    return true;
  }

  if (!cmSystemTools::FileIsFullPath(fname)) {
    bool system = false;
    // Not a path. Maybe module.
    std::string module = cmStrCat(fname, ".cmake");
    std::string mfile = status.GetMakefile().GetModulesFile(module, system);

    if (system) {
      auto ModulePolicy = DeprecatedModules.find(fname);
      if (ModulePolicy != DeprecatedModules.end()) {
        cmPolicies::PolicyStatus PolicyStatus =
          status.GetMakefile().GetPolicyStatus(ModulePolicy->second);
        switch (PolicyStatus) {
          case cmPolicies::WARN: {
            status.GetMakefile().IssueMessage(
              MessageType::AUTHOR_WARNING,
              cmStrCat(cmPolicies::GetPolicyWarning(ModulePolicy->second),
                       "\n"));
            CM_FALLTHROUGH;
          }
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            mfile = "";
            break;
        }
      }
    }

    if (!mfile.empty()) {
      fname = mfile;
    }
  }

  std::string fname_abs = cmSystemTools::CollapseFullPath(
    fname, status.GetMakefile().GetCurrentSourceDirectory());

  cmGlobalGenerator* gg = status.GetMakefile().GetGlobalGenerator();
  if (gg->IsExportedTargetsFile(fname_abs)) {
    const char* modal = nullptr;
    std::ostringstream e;
    MessageType messageType = MessageType::AUTHOR_WARNING;

    switch (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0024)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0024) << "\n";
        modal = "should";
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        modal = "may";
        messageType = MessageType::FATAL_ERROR;
    }
    if (modal) {
      e << "The file\n  " << fname_abs
        << "\nwas generated by the export() "
           "command.  It "
        << modal
        << " not be used as the argument to the "
           "include() command.  Use ALIAS targets instead to refer to targets "
           "by alternative names.\n";
      status.GetMakefile().IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
    gg->CreateGenerationObjects();
    gg->GenerateImportFile(fname_abs);
  }

  std::string listFile = cmSystemTools::CollapseFullPath(
    fname, status.GetMakefile().GetCurrentSourceDirectory());

  const bool fileDoesnotExist = !cmSystemTools::FileExists(listFile);
  const bool fileIsDirectory = cmSystemTools::FileIsDirectory(listFile);
  if (fileDoesnotExist || fileIsDirectory) {
    if (!resultVarName.empty()) {
      status.GetMakefile().AddDefinition(resultVarName, "NOTFOUND");
    }
    if (optional) {
      return true;
    }
    if (fileDoesnotExist) {
      status.SetError(cmStrCat("could not find requested file:\n  ", fname));
      return false;
    }
    if (fileIsDirectory) {
      status.SetError(cmStrCat("requested file is a directory:\n  ", fname));
      return false;
    }
  }

  bool readit =
    status.GetMakefile().ReadDependentFile(listFile, noPolicyScope);

  // add the location of the included file if a result variable was given
  if (!resultVarName.empty()) {
    status.GetMakefile().AddDefinition(
      resultVarName, readit ? fname_abs.c_str() : "NOTFOUND");
  }

  if (!optional && !readit && !cmSystemTools::GetFatalErrorOccurred()) {
    std::string m = cmStrCat("could not load requested file:\n  ", fname);
    status.SetError(m);
    return false;
  }
  return true;
}